

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_path_suspicious(mg_connection *conn,char *path)

{
  uint8_t *c;
  char *path_local;
  mg_connection *conn_local;
  
  if ((path == (char *)0x0) || (*path == '\0')) {
    conn_local._4_4_ = 1;
  }
  else {
    conn_local._4_4_ = 0;
  }
  return conn_local._4_4_;
}

Assistant:

static int
mg_path_suspicious(const struct mg_connection *conn, const char *path)
{
	const uint8_t *c = (const uint8_t *)path;
	(void)conn; /* not used */

	if ((c == NULL) || (c[0] == 0)) {
		/* Null pointer or empty path --> suspicious */
		return 1;
	}

#if defined(_WIN32)
	while (*c) {
		if (*c < 32) {
			/* Control character */
			return 1;
		}
		if ((*c == '>') || (*c == '<') || (*c == '|')) {
			/* stdin/stdout redirection character */
			return 1;
		}
		if ((*c == '*') || (*c == '?')) {
			/* Wildcard character */
			return 1;
		}
		if (*c == '"') {
			/* Windows quotation */
			return 1;
		}
		c++;
	}
#endif

	/* Nothing suspicious found */
	return 0;
}